

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int HalfFloatPlane(uint16_t *src_y,int src_stride_y,uint16_t *dst_y,int dst_stride_y,float scale,
                  int width,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  int iVar5;
  bool bVar6;
  int local_44;
  
  if ((height == 0 || width < 1) || (dst_y == (uint16_t *)0x0 || src_y == (uint16_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar5 = src_stride_y >> 1;
    local_44 = dst_stride_y >> 1;
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_y = src_y + ~height * iVar5;
      iVar5 = -iVar5;
    }
    if (local_44 == width && iVar5 == width) {
      width = width * iVar1;
      iVar1 = 1;
      iVar5 = 0;
      local_44 = 0;
    }
    iVar2 = libyuv::TestCpuFlag(0x20);
    if ((width & 7U) == 0) {
      pcVar3 = HalfFloatRow_SSE2;
    }
    else {
      pcVar3 = HalfFloatRow_Any_SSE2;
    }
    if (iVar2 == 0) {
      pcVar3 = HalfFloatRow_C;
    }
    iVar2 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar4 = HalfFloatRow_AVX2;
    }
    else {
      pcVar4 = HalfFloatRow_Any_AVX2;
    }
    if (iVar2 == 0) {
      pcVar4 = pcVar3;
    }
    while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
      (*pcVar4)(scale,src_y,dst_y,width);
      src_y = src_y + iVar5;
      dst_y = dst_y + local_44;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int HalfFloatPlane(const uint16_t* src_y,
                   int src_stride_y,
                   uint16_t* dst_y,
                   int dst_stride_y,
                   float scale,
                   int width,
                   int height) {
  int y;
  void (*HalfFloatRow)(const uint16_t* src, uint16_t* dst, float scale,
                       int width) = HalfFloatRow_C;
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  src_stride_y >>= 1;
  dst_stride_y >>= 1;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_HALFFLOATROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    HalfFloatRow = HalfFloatRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      HalfFloatRow = HalfFloatRow_SSE2;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    HalfFloatRow = HalfFloatRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      HalfFloatRow = HalfFloatRow_AVX2;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_F16C)
  if (TestCpuFlag(kCpuHasAVX2) && TestCpuFlag(kCpuHasF16C)) {
    HalfFloatRow =
        (scale == 1.0f) ? HalfFloat1Row_Any_F16C : HalfFloatRow_Any_F16C;
    if (IS_ALIGNED(width, 16)) {
      HalfFloatRow = (scale == 1.0f) ? HalfFloat1Row_F16C : HalfFloatRow_F16C;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    HalfFloatRow =
        (scale == 1.0f) ? HalfFloat1Row_Any_NEON : HalfFloatRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      HalfFloatRow = (scale == 1.0f) ? HalfFloat1Row_NEON : HalfFloatRow_NEON;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    HalfFloatRow = HalfFloatRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      HalfFloatRow = HalfFloatRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    HalfFloatRow(src_y, dst_y, scale, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
  return 0;
}